

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QAction * __thiscall QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon)

{
  QAction *pQVar1;
  QAction *this_00;
  QString local_38;
  QAction *local_20;
  QAction *action;
  QIcon *icon_local;
  ToolBar *this_local;
  
  action = (QAction *)icon;
  icon_local = (QIcon *)this;
  this_00 = (QAction *)operator_new(0x10);
  pQVar1 = action;
  QString::QString(&local_38);
  QAction::QAction(this_00,(QIcon *)pQVar1,(QString *)&local_38,(QObject *)this);
  QString::~QString(&local_38);
  local_20 = this_00;
  QWidget::addAction((QAction *)this);
  return local_20;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon )
{
	QAction * action = new QAction( icon, QString(), this );
	addAction( action );
	return action;
}